

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctstr_eq(char *s1,char *s2)

{
  char *local_20;
  char *s2_local;
  char *s1_local;
  
  if (s1 == s2) {
    s1_local._4_4_ = 1;
  }
  else if (((s1 == (char *)0x0) && (s2 != (char *)0x0)) ||
          ((local_20 = s2, s2_local = s1, s1 != (char *)0x0 && (s2 == (char *)0x0)))) {
    s1_local._4_4_ = 0;
  }
  else {
    for (; *s2_local == *local_20; s2_local = s2_local + 1) {
      if (*s2_local == '\0') {
        return 1;
      }
      local_20 = local_20 + 1;
    }
    s1_local._4_4_ = 0;
  }
  return s1_local._4_4_;
}

Assistant:

static int
fctstr_eq(char const *s1, char const *s2)
{
    if ( s1 == s2 )
    {
        return 1;
    }
    if ( (s1 == NULL && s2 != NULL)
            || (s1 != NULL && s2 == NULL) )
    {
        return 0;
    }
    while (*s1 == *s2)
    {
        if (*s1 == '\0')
            return 1;
        s1++;
        s2++;
    }
    /* Difference detected! */
    return 0;
}